

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libixy-vfio.c
# Opt level: O1

int vfio_setup_interrupt(int device_fd)

{
  __off_t __offset;
  long lVar1;
  ulong uVar2;
  code *pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  code *pcVar8;
  ssize_t sVar9;
  size_t sVar10;
  char *pcVar11;
  void *pvVar12;
  int __timeout;
  epoll_event *__events;
  undefined4 uVar13;
  ulong uVar14;
  char *__buf;
  epoll_event *peVar15;
  ulong unaff_R12;
  long lVar16;
  ulong *puVar17;
  code *unaff_R15;
  vfio_irq_info irq;
  char buf [512];
  undefined8 auStack_2b80 [2];
  size_t asStack_2b70 [67];
  long lStack_2958;
  int iStack_2950;
  uint uStack_294c;
  undefined8 uStack_2948;
  undefined1 auStack_2940 [512];
  stat sStack_2740;
  char acStack_26b0 [4096];
  char acStack_16b0 [4096];
  ulong auStack_6b0 [3];
  epoll_event aeStack_694 [33];
  undefined8 uStack_480;
  undefined8 uStack_478;
  epoll_event aeStack_470 [32];
  undefined1 auStack_270 [8];
  ulong uStack_268;
  ulong uStack_260;
  code *pcStack_240;
  ulong local_238;
  int local_230;
  undefined4 local_22c;
  undefined1 local_228 [512];
  
  puVar17 = &local_238;
  pcStack_240 = (code *)0x1073b6;
  fprintf(_stdout,"[INFO ] %s:%d %s(): Setup VFIO Interrupts\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c",0x97,
          "vfio_setup_interrupt");
  pcVar3 = (code *)0x2;
  while( true ) {
    pcVar8 = pcVar3;
    local_238 = 0x10;
    iVar6 = (int)pcVar8;
    local_22c = 0;
    uVar14 = 0x3b6d;
    pcStack_240 = (code *)0x1073e3;
    local_230 = iVar6;
    iVar4 = ioctl(device_fd,0x3b6d,&local_238);
    uVar2 = local_238;
    if (iVar4 == -1) break;
    unaff_R12 = local_238 >> 0x20;
    if ((local_238 & 0x100000000) == 0) {
      pcStack_240 = (code *)0x10740a;
      vfio_setup_interrupt_cold_1();
      pcVar8 = (code *)((ulong)unaff_R15 & 0xffffffff);
    }
    if ((uVar2 & 0x100000000) != 0) {
      return (int)pcVar8;
    }
    pcVar3 = (code *)(ulong)(iVar6 - 1);
    unaff_R15 = pcVar8;
    if (iVar6 == 0) {
      return -1;
    }
  }
  iVar4 = (int)local_228;
  pcStack_240 = vfio_epoll_wait;
  vfio_setup_interrupt_cold_2();
  lVar1 = -((uVar14 & 0xffffffff) * 0xc + 0xf & 0xfffffffffffffff0);
  __events = (epoll_event *)((long)aeStack_470 + lVar1);
  uStack_268 = (ulong)(uint)device_fd;
  uStack_260 = unaff_R12;
  pcStack_240 = pcVar8;
  *(undefined8 *)((long)&uStack_478 + lVar1) = 0x107469;
  uVar5 = epoll_wait(iVar4,__events,(int)uVar14,__timeout);
  if (uVar5 != 0xffffffff) {
    puVar17 = (ulong *)(ulong)uVar5;
    if (0 < (int)uVar5) {
      lVar16 = 0;
      do {
        iVar4 = *(int *)((long)aeStack_470 + lVar16 + lVar1 + 4);
        *(undefined8 *)((long)&uStack_478 + lVar1) = 0x107499;
        sVar9 = read(iVar4,auStack_270,8);
        if (sVar9 == -1) {
          *(undefined8 *)((long)&uStack_478 + lVar1) = 0x1074c6;
          vfio_epoll_wait_cold_1();
          goto LAB_001074c6;
        }
        lVar16 = lVar16 + 0xc;
      } while ((long)puVar17 * 0xc != lVar16);
    }
    return uVar5;
  }
LAB_001074c6:
  peVar15 = aeStack_470;
  *(code **)((long)&uStack_478 + lVar1) = vfio_epoll_ctl;
  vfio_epoll_wait_cold_2();
  *(code ***)((long)&uStack_478 + lVar1) = &pcStack_240;
  *(epoll_event **)((long)&uStack_480 + lVar1) = __events;
  *(undefined4 *)((long)aeStack_694 + lVar1) = 1;
  *(int *)((long)aeStack_694 + lVar1 + 4) = (int)peVar15;
  *(undefined8 *)((long)auStack_6b0 + lVar1 + 0x10) = 0x1074f0;
  uVar5 = epoll_create1(0);
  if (uVar5 == 0xffffffff) {
    *(undefined8 *)((long)auStack_6b0 + lVar1 + 0x10) = 0x107525;
    vfio_epoll_ctl_cold_2();
  }
  else {
    __events = (epoll_event *)(ulong)uVar5;
    *(undefined8 *)((long)auStack_6b0 + lVar1 + 0x10) = 0x10750a;
    iVar4 = epoll_ctl(uVar5,1,(int)peVar15,(epoll_event *)((long)aeStack_694 + lVar1));
    if (iVar4 != -1) {
      return uVar5;
    }
  }
  lVar16 = (long)aeStack_694 + lVar1 + 0xc;
  *(code **)((long)auStack_6b0 + lVar1 + 0x10) = vfio_init;
  vfio_epoll_ctl_cold_1();
  *(ulong *)((long)auStack_6b0 + lVar1 + 0x10) = (ulong)peVar15 & 0xffffffff;
  *(ulong **)((long)auStack_6b0 + lVar1 + 8) = puVar17;
  *(epoll_event **)((long)auStack_6b0 + lVar1) = __events;
  *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10755e;
  snprintf(acStack_16b0 + lVar1,0x1000,"/sys/bus/pci/devices/%s/",lVar16);
  *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10756e;
  iVar4 = stat(acStack_16b0 + lVar1,(stat *)((long)&sStack_2740 + lVar1));
  if (iVar4 < 0) {
    return -1;
  }
  pcVar11 = acStack_16b0 + lVar1;
  *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107586;
  sVar10 = strlen(pcVar11);
  *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10759d;
  strncat(pcVar11,"iommu_group",0xfff - sVar10);
  __buf = acStack_26b0 + lVar1;
  *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1075b2;
  sVar9 = readlink(pcVar11,__buf,0x1000);
  uVar13 = SUB84(__buf,0);
  if (sVar9 == -1) {
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107744;
    vfio_init_cold_11();
LAB_00107744:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10774e;
    vfio_init_cold_10();
LAB_0010774e:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107758;
    vfio_init_cold_8();
LAB_00107758:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107762;
    vfio_init_cold_7();
LAB_00107762:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10776c;
    vfio_init_cold_6();
LAB_0010776c:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107776;
    vfio_init_cold_5();
LAB_00107776:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107780;
    vfio_init_cold_3();
LAB_00107780:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10778a;
    vfio_init_cold_9();
LAB_0010778a:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107794;
    vfio_init_cold_1();
LAB_00107794:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10779e;
    vfio_init_cold_2();
  }
  else {
    acStack_26b0[(int)sVar9 + lVar1] = '\0';
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1075d3;
    pcVar11 = __xpg_basename(acStack_26b0 + lVar1);
    uVar13 = 0x108468;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1075e9;
    iVar4 = __isoc99_sscanf(pcVar11,"%d",(long)&uStack_294c + lVar1);
    if (iVar4 == -1) goto LAB_00107744;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1075f9;
    iVar4 = get_vfio_container();
    *(int *)((long)&iStack_2950 + lVar1) = iVar4;
    if (iVar4 == -1) {
      uVar13 = 2;
      *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107616;
      iVar6 = open("/dev/vfio/vfio",2);
      if (iVar6 == -1) goto LAB_00107780;
      *(int *)((long)&iStack_2950 + lVar1) = iVar6;
      *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107629;
      set_vfio_container(iVar6);
      uVar13 = 0x3b64;
      *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107638;
      iVar6 = ioctl(*(int *)((long)&iStack_2950 + lVar1),0x3b64);
      if (iVar6 != 0) goto LAB_0010778a;
      uVar13 = 0x3b65;
      *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107654;
      iVar6 = ioctl(*(int *)((long)&iStack_2950 + lVar1),0x3b65,1);
      if (iVar6 == 1) goto LAB_0010765d;
      goto LAB_00107794;
    }
LAB_0010765d:
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10767f;
    snprintf(acStack_16b0 + lVar1,0x1000,"/dev/vfio/%d",(ulong)*(uint *)((long)&uStack_294c + lVar1)
            );
    uVar13 = 2;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x10768e;
    iVar6 = open(acStack_16b0 + lVar1,2);
    if (iVar6 == -1) goto LAB_0010774e;
    *(undefined8 *)((long)&uStack_2948 + lVar1) = 8;
    uVar13 = 0x3b67;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1076b4;
    iVar7 = ioctl(iVar6,0x3b67);
    if (iVar7 == -1) goto LAB_00107758;
    if ((auStack_2940[lVar1 + -4] & 1) == 0) goto LAB_00107762;
    uVar13 = 0x3b68;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1076da;
    iVar7 = ioctl(iVar6,0x3b68,(long)&iStack_2950 + lVar1);
    if (iVar7 == -1) goto LAB_0010776c;
    if (iVar4 != -1) {
LAB_00107705:
      uVar13 = 0x3b6a;
      *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107717;
      iVar4 = ioctl(iVar6,0x3b6a,lVar16);
      if (iVar4 != -1) {
        *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x107725;
        vfio_enable_dma(iVar4);
        return iVar4;
      }
      goto LAB_00107776;
    }
    uVar13 = 0x3b66;
    *(undefined8 *)((long)&lStack_2958 + lVar1) = 0x1076fc;
    iVar4 = ioctl(*(int *)((long)&iStack_2950 + lVar1),0x3b66,1);
    if (iVar4 != -1) goto LAB_00107705;
  }
  iVar4 = (int)auStack_2940 + (int)lVar1;
  *(code **)((long)&lStack_2958 + lVar1) = vfio_map_region;
  vfio_init_cold_4();
  *(long *)((long)&lStack_2958 + lVar1) = lVar16;
  *(undefined8 *)((long)auStack_2b80 + lVar1 + 8) = 0x20;
  *(undefined8 *)((long)asStack_2b70 + lVar1) = 0;
  *(undefined8 *)((long)asStack_2b70 + lVar1 + 8) = 0;
  *(undefined8 *)((long)asStack_2b70 + lVar1 + 0x10) = 0;
  *(undefined4 *)((long)asStack_2b70 + lVar1) = uVar13;
  *(undefined8 *)((long)auStack_2b80 + lVar1) = 0x1077d3;
  iVar6 = ioctl(iVar4,0x3b6c);
  if (iVar6 != -1) {
    sVar10 = *(size_t *)((long)asStack_2b70 + lVar1 + 8);
    __offset = *(__off_t *)((long)asStack_2b70 + lVar1 + 0x10);
    *(undefined8 *)((long)auStack_2b80 + lVar1) = 0x1077f6;
    pvVar12 = mmap((void *)0x0,sVar10,3,1,iVar4,__offset);
    if (pvVar12 != (void *)0xffffffffffffffff) goto LAB_0010780d;
    *(undefined8 *)((long)auStack_2b80 + lVar1) = 0x107806;
    vfio_map_region_cold_1();
  }
  pvVar12 = (void *)0xffffffffffffffff;
LAB_0010780d:
  return (int)pvVar12;
}

Assistant:

int vfio_setup_interrupt(int device_fd) {
	info("Setup VFIO Interrupts");

	for (int i = VFIO_PCI_MSIX_IRQ_INDEX; i >= 0; i--) {
		struct vfio_irq_info irq = {.argsz = sizeof(irq), .index = i};

		check_err(ioctl(device_fd, VFIO_DEVICE_GET_IRQ_INFO, &irq), "get IRQ Info");

		/* if this vector cannot be used with eventfd continue with next*/
		if ((irq.flags & VFIO_IRQ_INFO_EVENTFD) == 0) {
			debug("IRQ doesn't support Event FD");
			continue;
		}

		return i;
	}

	return -1;
}